

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launchByAssociation.h
# Opt level: O2

int util::launchByAssociation(string *location)

{
  int iVar1;
  ostream *poVar2;
  ostringstream cmd;
  char *local_1a8 [4];
  ostringstream local_188 [376];
  
  if (launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&launchByAssociation(std::__cxx11::string_const&)::
                                 LAUNCH_CMD_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_,
                 "xdg-open ",(allocator<char> *)local_188);
      __cxa_atexit(std::__cxx11::string::~string,
                   &launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_);
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = std::operator<<((ostream *)local_188,
                           (string *)
                           &launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_)
  ;
  std::operator<<(poVar2,(string *)location);
  std::__cxx11::stringbuf::str();
  iVar1 = system(local_1a8[0]);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return iVar1;
}

Assistant:

int launchByAssociation(std::string const& location) {
#if defined(_WIN32)
		static const std::string LAUNCH_CMD = "start \"launchByAssociation\" ";
#elif defined(__APPLE__)
		static const std::string LAUNCH_CMD = "open ";
#else
		// Assume we're on a freedesktop.org system with xdg-utils
		static const std::string LAUNCH_CMD = "xdg-open ";
#endif
		std::ostringstream cmd;
		cmd << LAUNCH_CMD << location;
		return system(cmd.str().c_str());
	}